

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  cmFunctionBlocker **ppcVar1;
  size_type sVar2;
  char cVar3;
  ulong uVar4;
  ostream *poVar5;
  cmCommandContext *in_RCX;
  ulong uVar6;
  cmFunctionBlocker *pcVar7;
  const_iterator __position;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  ostream local_1a8;
  
  sVar2 = fb[8].StartingContext.FilePath.field_2._M_allocated_capacity;
  if (fb[8].StartingContext.FilePath._M_string_length == sVar2) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ulong *)(sVar2 - 8);
  }
  __position._M_current = *(cmFunctionBlocker ***)((long)&fb[8].StartingContext.Name.field_2 + 8);
  uVar6 = (long)((long)__position._M_current -
                fb[8].StartingContext.Name.field_2._M_allocated_capacity) >> 3;
  pcVar7 = (cmFunctionBlocker *)0x0;
  do {
    if (uVar6 <= uVar4) goto LAB_003bfd29;
    uVar6 = uVar6 - 1;
    ppcVar1 = __position._M_current + -1;
    __position._M_current = __position._M_current + -1;
  } while (*ppcVar1 != (cmFunctionBlocker *)lff);
  cVar3 = (**(code **)((((cmCommandContext *)&(*ppcVar1)->_vptr_cmFunctionBlocker)->Name).
                       _M_dataplus._M_p + 8))();
  if (cVar3 == '\0') {
    cmListFileContext::FromCommandContext(&local_1f0,in_RCX,(string *)&lff->Arguments);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar5 = std::operator<<(&local_1a8,"A logical block opening on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = operator<<(poVar5,(cmListFileContext *)
                               &(lff->super_cmCommandContext).Name._M_string_length);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"closes on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = operator<<(poVar5,&local_1f0);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"with mis-matching arguments.");
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    cmListFileContext::~cmListFileContext(&local_1f0);
  }
  pcVar7 = *__position._M_current;
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::erase
            ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
             &fb[8].StartingContext.Name.field_2,__position);
LAB_003bfd29:
  (this->FindPackageModuleStack).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pcVar7;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

CM_AUTO_PTR<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return CM_AUTO_PTR<cmFunctionBlocker>(b);
    }
  }

  return CM_AUTO_PTR<cmFunctionBlocker>();
}